

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsEntitiesToSides(FmsIntType idx_type,FmsInt ent_sides,FmsInt loc_side_begin,
                      FmsInt num_loc_sides,void *ents,FmsInt side_sides,void *sides,
                      FmsInt res_stride,FmsInt res_off,FmsInt *res,FmsInt num_ents)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int in_EAX;
  ulong uVar9;
  FmsInt *pFVar10;
  FmsInt FVar11;
  FmsInt FVar12;
  int8_t *sides_;
  FmsInt FVar13;
  FmsInt *pFVar14;
  
  if (idx_type < FMS_NUM_INT_TYPES) {
    pFVar10 = res + res_off;
    uVar9 = num_ents;
    switch(idx_type) {
    case FMS_INT8:
      if (num_ents != 0) {
        FVar12 = 0;
        do {
          if (num_loc_sides != 0) {
            FVar13 = 0;
            pFVar14 = pFVar10;
            do {
              if (side_sides != 0) {
                cVar2 = *(char *)((long)ents + FVar13 + FVar12 * ent_sides + loc_side_begin);
                FVar11 = 0;
                do {
                  uVar9 = (ulong)*(char *)((long)sides + FVar11 + (long)cVar2 * side_sides);
                  pFVar14[FVar11] = uVar9;
                  FVar11 = FVar11 + 1;
                } while (side_sides != FVar11);
              }
              FVar13 = FVar13 + 1;
              pFVar14 = pFVar14 + side_sides;
            } while (FVar13 != num_loc_sides);
          }
          FVar12 = FVar12 + 1;
          pFVar10 = pFVar10 + res_stride;
        } while (FVar12 != num_ents);
      }
      break;
    case FMS_INT16:
      if (num_ents != 0) {
        FVar12 = 0;
        do {
          if (num_loc_sides != 0) {
            uVar9 = FVar12 * ent_sides;
            lVar1 = uVar9 * 2;
            FVar13 = 0;
            pFVar14 = pFVar10;
            do {
              if (side_sides != 0) {
                sVar4 = *(short *)((long)ents + FVar13 * 2 + lVar1 + loc_side_begin * 2);
                FVar11 = 0;
                do {
                  uVar9 = (ulong)*(short *)((long)sides + FVar11 * 2 + (long)sVar4 * side_sides * 2)
                  ;
                  pFVar14[FVar11] = uVar9;
                  FVar11 = FVar11 + 1;
                } while (side_sides != FVar11);
              }
              FVar13 = FVar13 + 1;
              pFVar14 = pFVar14 + side_sides;
            } while (FVar13 != num_loc_sides);
          }
          FVar12 = FVar12 + 1;
          pFVar10 = pFVar10 + res_stride;
        } while (FVar12 != num_ents);
      }
      break;
    case FMS_INT32:
      if (num_ents != 0) {
        FVar12 = 0;
        do {
          if (num_loc_sides != 0) {
            uVar9 = FVar12 * ent_sides;
            lVar1 = uVar9 * 4;
            FVar13 = 0;
            pFVar14 = pFVar10;
            do {
              if (side_sides != 0) {
                iVar6 = *(int *)((long)ents + FVar13 * 4 + lVar1 + loc_side_begin * 4);
                FVar11 = 0;
                do {
                  uVar9 = (ulong)*(int *)((long)sides + FVar11 * 4 + (long)iVar6 * side_sides * 4);
                  pFVar14[FVar11] = uVar9;
                  FVar11 = FVar11 + 1;
                } while (side_sides != FVar11);
              }
              FVar13 = FVar13 + 1;
              pFVar14 = pFVar14 + side_sides;
            } while (FVar13 != num_loc_sides);
          }
          FVar12 = FVar12 + 1;
          pFVar10 = pFVar10 + res_stride;
        } while (FVar12 != num_ents);
      }
      break;
    case FMS_INT64:
      if (num_ents != 0) {
        FVar12 = 0;
        do {
          if (num_loc_sides != 0) {
            uVar9 = FVar12 * ent_sides;
            lVar1 = uVar9 * 8;
            FVar13 = 0;
            pFVar14 = pFVar10;
            do {
              if (side_sides != 0) {
                lVar8 = *(long *)((long)ents + FVar13 * 8 + lVar1 + loc_side_begin * 8);
                FVar11 = 0;
                do {
                  uVar9 = *(ulong *)((long)sides + FVar11 * 8 + lVar8 * side_sides * 8);
                  pFVar14[FVar11] = uVar9;
                  FVar11 = FVar11 + 1;
                } while (side_sides != FVar11);
              }
              FVar13 = FVar13 + 1;
              pFVar14 = pFVar14 + side_sides;
            } while (FVar13 != num_loc_sides);
          }
          FVar12 = FVar12 + 1;
          pFVar10 = pFVar10 + res_stride;
        } while (FVar12 != num_ents);
      }
      break;
    case FMS_ORIENTATION_INT_TYPE:
      if (num_ents != 0) {
        FVar12 = 0;
        do {
          if (num_loc_sides != 0) {
            FVar13 = 0;
            pFVar14 = pFVar10;
            do {
              if (side_sides != 0) {
                bVar3 = *(byte *)((long)ents + FVar13 + FVar12 * ent_sides + loc_side_begin);
                FVar11 = 0;
                do {
                  uVar9 = (ulong)*(byte *)((long)sides + FVar11 + bVar3 * side_sides);
                  pFVar14[FVar11] = uVar9;
                  FVar11 = FVar11 + 1;
                } while (side_sides != FVar11);
              }
              FVar13 = FVar13 + 1;
              pFVar14 = pFVar14 + side_sides;
            } while (FVar13 != num_loc_sides);
          }
          FVar12 = FVar12 + 1;
          pFVar10 = pFVar10 + res_stride;
        } while (FVar12 != num_ents);
      }
      break;
    case FMS_UINT16:
      if (num_ents != 0) {
        FVar12 = 0;
        do {
          if (num_loc_sides != 0) {
            uVar9 = FVar12 * ent_sides;
            lVar1 = uVar9 * 2;
            FVar13 = 0;
            pFVar14 = pFVar10;
            do {
              if (side_sides != 0) {
                uVar5 = *(ushort *)((long)ents + FVar13 * 2 + lVar1 + loc_side_begin * 2);
                FVar11 = 0;
                do {
                  uVar9 = (ulong)*(ushort *)((long)sides + FVar11 * 2 + uVar5 * side_sides * 2);
                  pFVar14[FVar11] = uVar9;
                  FVar11 = FVar11 + 1;
                } while (side_sides != FVar11);
              }
              FVar13 = FVar13 + 1;
              pFVar14 = pFVar14 + side_sides;
            } while (FVar13 != num_loc_sides);
          }
          FVar12 = FVar12 + 1;
          pFVar10 = pFVar10 + res_stride;
        } while (FVar12 != num_ents);
      }
      break;
    case FMS_UINT32:
      if (num_ents != 0) {
        FVar12 = 0;
        do {
          if (num_loc_sides != 0) {
            uVar9 = FVar12 * ent_sides;
            lVar1 = uVar9 * 4;
            FVar13 = 0;
            pFVar14 = pFVar10;
            do {
              if (side_sides != 0) {
                uVar7 = *(uint *)((long)ents + FVar13 * 4 + lVar1 + loc_side_begin * 4);
                FVar11 = 0;
                do {
                  uVar9 = (ulong)*(uint *)((long)sides + FVar11 * 4 + uVar7 * side_sides * 4);
                  pFVar14[FVar11] = uVar9;
                  FVar11 = FVar11 + 1;
                } while (side_sides != FVar11);
              }
              FVar13 = FVar13 + 1;
              pFVar14 = pFVar14 + side_sides;
            } while (FVar13 != num_loc_sides);
          }
          FVar12 = FVar12 + 1;
          pFVar10 = pFVar10 + res_stride;
        } while (FVar12 != num_ents);
      }
      break;
    case FMS_INT_TYPE:
      if (num_ents != 0) {
        FVar12 = 0;
        do {
          if (num_loc_sides != 0) {
            uVar9 = FVar12 * ent_sides;
            lVar1 = uVar9 * 8;
            FVar13 = 0;
            pFVar14 = pFVar10;
            do {
              if (side_sides != 0) {
                lVar8 = *(long *)((long)ents + FVar13 * 8 + lVar1 + loc_side_begin * 8);
                FVar11 = 0;
                do {
                  uVar9 = *(ulong *)((long)sides + FVar11 * 8 + lVar8 * side_sides * 8);
                  pFVar14[FVar11] = uVar9;
                  FVar11 = FVar11 + 1;
                } while (side_sides != FVar11);
              }
              FVar13 = FVar13 + 1;
              pFVar14 = pFVar14 + side_sides;
            } while (FVar13 != num_loc_sides);
          }
          FVar12 = FVar12 + 1;
          pFVar10 = pFVar10 + res_stride;
        } while (FVar12 != num_ents);
      }
    }
    in_EAX = (int)uVar9;
  }
  return in_EAX;
}

Assistant:

static int FmsEntitiesToSides(FmsIntType idx_type, FmsInt ent_sides,
                              FmsInt loc_side_begin, FmsInt num_loc_sides,
                              const void *ents, FmsInt side_sides,
                              const void *sides, FmsInt res_stride,
                              FmsInt res_off, FmsInt *res, FmsInt num_ents) {
  if (idx_type >= FMS_NUM_INT_TYPES) { E_RETURN(1); }
  FmsInt *res_ = res + res_off;
  switch (idx_type) {
  case FMS_INT8:   FMS_E2S_TEMPL(int8_t);
  case FMS_INT16:  FMS_E2S_TEMPL(int16_t);
  case FMS_INT32:  FMS_E2S_TEMPL(int32_t);
  case FMS_INT64:  FMS_E2S_TEMPL(int64_t);
  case FMS_UINT8:  FMS_E2S_TEMPL(uint8_t);
  case FMS_UINT16: FMS_E2S_TEMPL(uint16_t);
  case FMS_UINT32: FMS_E2S_TEMPL(uint32_t);
  case FMS_UINT64: FMS_E2S_TEMPL(uint64_t);
  default: FmsAbortNotImplemented();
  }
  return 0;
}